

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_nearest_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  
  iVar2 = dst->c;
  if (0 < (long)iVar2) {
    iVar7 = dst->h * dst->w * dst->d;
    lVar8 = 0;
    do {
      if (0 < iVar7) {
        sVar3 = src->cstep;
        sVar4 = src->elemsize;
        pvVar5 = src->data;
        pvVar6 = offset_value->data;
        puVar9 = (undefined8 *)(dst->cstep * lVar8 * dst->elemsize + (long)dst->data);
        lVar10 = 0;
        do {
          lVar11 = (long)*(int *)((long)pvVar6 + lVar10 * 4);
          if (lVar11 < 0) {
            uVar12 = 0;
            uVar13 = 0;
          }
          else {
            puVar1 = (undefined8 *)((long)pvVar5 + lVar11 * 4 + sVar3 * lVar8 * sVar4);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
          }
          *puVar9 = uVar12;
          puVar9[1] = uVar13;
          puVar9 = puVar9 + 2;
          lVar10 = lVar10 + 1;
        } while (iVar7 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar2);
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m128 _v = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            offset_ptr++;

            _mm_storeu_ps(dstptr, _v);
            dstptr += 4;
        }
    }
}